

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.h
# Opt level: O2

Maybe<char> __thiscall
kj::parse::CharGroup_::operator()(CharGroup_ *this,IteratorInput<char,_const_char_*> *input)

{
  byte bVar1;
  byte *pbVar2;
  long in_RDX;
  
  pbVar2 = *(byte **)(in_RDX + 8);
  if ((pbVar2 != *(byte **)(in_RDX + 0x10)) &&
     (bVar1 = *pbVar2, ((ulong)(&input->parent)[bVar1 >> 6] >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
    *(byte **)(in_RDX + 8) = pbVar2 + 1;
    *(undefined1 *)this->bits = 1;
    *(byte *)((long)this->bits + 1) = bVar1;
    return (Maybe<char>)SUB82(this,0);
  }
  *(undefined1 *)this->bits = 0;
  return (Maybe<char>)SUB82(this,0);
}

Assistant:

Maybe<char> operator()(Input& input) const {
    if (input.atEnd()) return nullptr;
    unsigned char c = input.current();
    if (contains(c)) {
      input.next();
      return c;
    } else {
      return nullptr;
    }
  }